

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_work_stealing.cpp
# Opt level: O0

void starvation_loop(size_t W)

{
  code *pcVar1;
  byte extraout_AL;
  Executor *this;
  Enum EVar2;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> **__stat_loc;
  double __x;
  Expression_lhs<const_unsigned_long_&> EVar3;
  Task task;
  size_t b;
  size_t l;
  Task second;
  Task curr;
  Task prev;
  type *stop;
  type *cond;
  type *merge;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> set;
  mutex mutex;
  atomic<unsigned_long> barrier;
  atomic<unsigned_long> counter;
  Executor executor;
  Taskflow taskflow;
  ResultBuilder DOCTEST_RB;
  size_t B;
  size_t L;
  Result *res;
  Taskflow *in_stack_fffffffffffffb40;
  Executor *in_stack_fffffffffffffb48;
  char *in_stack_fffffffffffffb50;
  Task *this_00;
  undefined8 in_stack_fffffffffffffb58;
  Taskflow *in_stack_fffffffffffffb60;
  anon_class_24_3_bb00f4f4 *cs_2;
  undefined4 in_stack_fffffffffffffb68;
  undefined4 uVar4;
  char *in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffb78;
  Enum at;
  anon_class_48_6_8be78025 *in_stack_fffffffffffffb80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffb88;
  unsigned_long *in_stack_fffffffffffffbc0;
  Expression_lhs<const_unsigned_long_&> *in_stack_fffffffffffffbc8;
  ulong local_428;
  Task local_410;
  ulong local_408;
  Task local_400;
  Task local_3f8;
  Task local_3f0;
  __tuple_element_t<2UL,_tuple<Task,_Task,_Task>_> *local_3e8;
  __tuple_element_t<1UL,_tuple<Task,_Task,_Task>_> *local_3e0;
  shared_ptr<tf::WorkerInterface> *in_stack_fffffffffffffc28;
  size_t in_stack_fffffffffffffc30;
  Executor *in_stack_fffffffffffffc38;
  Task local_368 [12];
  undefined8 local_308;
  undefined8 local_300;
  anon_class_24_3_bb00f4f4 local_2f8 [22];
  Executor *local_e8;
  Enum local_e0;
  ExpressionDecomposer local_c4;
  Executor *local_c0;
  Enum local_b8;
  ResultBuilder local_90;
  ulong local_18;
  ulong local_10;
  
  local_10 = 100;
  local_18 = 0x400;
  res = (Result *)0x18308d;
  at = DT_REQUIRE;
  doctest::detail::ResultBuilder::ResultBuilder
            ((ResultBuilder *)in_stack_fffffffffffffb60,
             (Enum)((ulong)in_stack_fffffffffffffb58 >> 0x20),in_stack_fffffffffffffb50,
             (int)((ulong)in_stack_fffffffffffffb48 >> 0x20),(char *)in_stack_fffffffffffffb40,"",
             in_stack_fffffffffffffb70);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_c4,at);
  EVar3 = doctest::detail::ExpressionDecomposer::operator<<<unsigned_long,_nullptr>
                    ((ExpressionDecomposer *)in_stack_fffffffffffffb40,(unsigned_long *)res);
  this = (Executor *)EVar3.lhs;
  EVar2 = EVar3.m_at;
  local_e8 = this;
  local_e0 = EVar2;
  local_c0 = this;
  local_b8 = EVar2;
  doctest::detail::Expression_lhs<const_unsigned_long_&>::operator><unsigned_long,_nullptr>
            (in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
  doctest::detail::ResultBuilder::setResult((ResultBuilder *)in_stack_fffffffffffffb40,res);
  doctest::detail::Result::~Result((Result *)0x118439);
  doctest::detail::ResultBuilder::log(&local_90,__x);
  uVar4 = CONCAT13(extraout_AL,(int3)in_stack_fffffffffffffb68);
  if ((extraout_AL & 1) == 0) {
    doctest::detail::ResultBuilder::react((ResultBuilder *)in_stack_fffffffffffffb40);
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x11850c);
    tf::Taskflow::Taskflow(in_stack_fffffffffffffb60);
    cs_2 = local_2f8;
    std::shared_ptr<tf::WorkerInterface>::shared_ptr
              ((shared_ptr<tf::WorkerInterface> *)in_stack_fffffffffffffb40,res);
    tf::Executor::Executor
              (in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x118562);
    local_300 = 0;
    local_308 = 0;
    std::mutex::mutex((mutex *)0x118587);
    this_00 = local_368;
    std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::unordered_set
              ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
               0x118599);
    tf::FlowBuilder::
    emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_work_stealing_cpp:193:5),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_work_stealing_cpp:201:5),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_work_stealing_cpp:204:5),_nullptr>
              ((FlowBuilder *)CONCAT44(at,in_stack_fffffffffffffb78),
               (anon_class_48_6_5dcfefc9 *)this,(anon_class_4_1_54a3980e *)CONCAT44(EVar2,uVar4),
               cs_2);
    std::get<0ul,tf::Task,tf::Task,tf::Task>((tuple<tf::Task,_tf::Task,_tf::Task> *)0x118655);
    local_3e0 = std::get<1ul,tf::Task,tf::Task,tf::Task>
                          ((tuple<tf::Task,_tf::Task,_tf::Task> *)0x11866a);
    local_3e8 = std::get<2ul,tf::Task,tf::Task,tf::Task>
                          ((tuple<tf::Task,_tf::Task,_tf::Task> *)0x11867f);
    tf::Task::Task(&local_3f0);
    tf::Task::Task(&local_3f8);
    tf::Task::Task(&local_400);
    for (local_408 = 0; local_408 < local_10; local_408 = local_408 + 1) {
      tf::FlowBuilder::
      emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_work_stealing_cpp:216:29),_nullptr>
                ((FlowBuilder *)in_stack_fffffffffffffb88._M_pi,
                 (anon_class_16_2_9e646a39 *)in_stack_fffffffffffffb80);
      tf::Task::operator=(&local_3f8,&local_410);
      if (local_408 != 0) {
        tf::Task::succeed<tf::Task&>((Task *)in_stack_fffffffffffffb40,(Task *)res);
      }
      if (local_408 == 1) {
        tf::Task::operator=(&local_400,&local_3f8);
      }
      tf::Task::operator=(&local_3f0,&local_3f8);
    }
    tf::Task::precede<tf::Task&,tf::Task&>
              (this_00,(Task *)in_stack_fffffffffffffb48,(Task *)in_stack_fffffffffffffb40);
    for (local_428 = 0; local_428 < local_18; local_428 = local_428 + 1) {
      tf::FlowBuilder::
      emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_work_stealing_cpp:238:38),_nullptr>
                ((FlowBuilder *)in_stack_fffffffffffffb88._M_pi,in_stack_fffffffffffffb80);
      in_stack_fffffffffffffb48 =
           (Executor *)tf::Task::succeed<tf::Task&>((Task *)in_stack_fffffffffffffb40,(Task *)res);
      tf::Task::precede<tf::Task&>((Task *)in_stack_fffffffffffffb40,(Task *)res);
    }
    tf::Task::precede<tf::Task&>((Task *)in_stack_fffffffffffffb40,(Task *)res);
    __stat_loc = &local_2f8[0].set;
    tf::Executor::run(in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
    std::__basic_future<void>::wait((__basic_future<void> *)&stack0xfffffffffffffb80,__stat_loc);
    tf::Future<void>::~Future((Future<void> *)in_stack_fffffffffffffb40);
    std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
    ~unordered_set((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                   0x118946);
    tf::Executor::~Executor(this);
    tf::Taskflow::~Taskflow(in_stack_fffffffffffffb40);
    return;
  }
  pcVar1 = (code *)swi(3);
  (*pcVar1)();
  return;
}

Assistant:

void starvation_loop(size_t W) {

  size_t L=100, B = 1024;

  REQUIRE(B > W);
  
  tf::Taskflow taskflow;
  tf::Executor executor(W);

  std::atomic<size_t> counter{0};
  std::atomic<size_t> barrier{0};

  // all worker must be involved
  std::mutex mutex;
  std::unordered_set<int> set;

  auto [merge, cond, stop] = taskflow.emplace(
    [&](){  
      REQUIRE(barrier.load(std::memory_order_relaxed) == B);
      REQUIRE(counter.load(std::memory_order_relaxed) == (L + B - 1));
      REQUIRE(set.size() == W);
      counter = 0;
      barrier = 0;
      set.clear();
    },
    [n=0]() mutable { 
      return ++n >= 10 ? 1 : 0;
    },
    [&](){
      REQUIRE(barrier.load(std::memory_order_relaxed) == 0);
      REQUIRE(counter.load(std::memory_order_relaxed) == 0);
      REQUIRE(set.size() == 0);
    }
  );

  tf::Task prev, curr, second;
  
  // linear chain with delay to make workers sleep
  for(size_t l=0; l<L; l++) {

    curr = taskflow.emplace([&, l](){
      if(l) {
        counter.fetch_add(1, std::memory_order_relaxed);
      }
    });

    if(l) {
      curr.succeed(prev);
    }

    if(l==1) {
      second = curr;
    }

    prev = curr;
  }
  
  cond.precede(second, stop);


  // fork
  for(size_t b=0; b<B; b++) {
    tf::Task task = taskflow.emplace([&](){
      // record the threads
      {
        std::scoped_lock lock(mutex);
        set.insert(executor.this_worker_id());
      }

      // all threads should be notified
      barrier.fetch_add(1, std::memory_order_relaxed);
      while(barrier.load(std::memory_order_relaxed) < W){
        std::this_thread::yield();
      }
      
      // increment the counter
      counter.fetch_add(1, std::memory_order_relaxed);
    });
    task.succeed(curr)
        .precede(merge);
  }

  merge.precede(cond);

  //taskflow.dump(std::cout);
  executor.run(taskflow).wait();
}